

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_ObjY(FParser *this)

{
  double local_30;
  AActor *local_18;
  AActor *mo;
  FParser *this_local;
  
  if (this->t_argc == 0) {
    local_18 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
  }
  else {
    local_18 = actorvalue(this->t_argv);
  }
  if (local_18 == (AActor *)0x0) {
    local_30 = 0.0;
  }
  else {
    local_30 = AActor::Y(local_18);
  }
  svalue_t::setDouble(&this->t_return,local_30);
  return;
}

Assistant:

void FParser::SF_ObjY(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.setDouble(mo ? mo->Y() : 0.);
}